

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O1

ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> ** __thiscall
Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::Register
          (ThreadCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *this,
          ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> *cache)

{
  RealCount *pRVar1;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *pDVar2;
  DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
  *pDVar3;
  
  pDVar3 = (DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
            *)new<Memory::ArenaAllocator>(0x18,&this->arena,0x366bee);
  pDVar3[1].next.base =
       (DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
        *)cache;
  pDVar2 = (this->scriptRegistrations).
           super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
           .next.base;
  pDVar3->prev = pDVar2->prev;
  (pDVar3->next).base = pDVar2;
  *(DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>_*>
    **)pDVar2->prev = pDVar3;
  (pDVar2->prev).base = pDVar3;
  pRVar1 = &(this->scriptRegistrations).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return (ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_> **)(pDVar3 + 1);
}

Assistant:

ScriptCacheRegistry<T>**
ThreadCacheRegistry<T>::Register(_In_ ScriptCacheRegistry<T>* cache)
{
    return this->scriptRegistrations.PrependNode(&this->arena, cache);
}